

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collate_expression.cpp
# Opt level: O1

bool duckdb::CollateExpression::Equal(CollateExpression *a,CollateExpression *b)

{
  size_t __n;
  int iVar1;
  pointer pPVar2;
  type pPVar3;
  bool bVar4;
  
  pPVar2 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator->(&a->child);
  pPVar3 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator*(&b->child);
  iVar1 = (*(pPVar2->super_BaseExpression)._vptr_BaseExpression[10])(pPVar2,pPVar3);
  if (((char)iVar1 == '\0') ||
     (__n = (a->collation)._M_string_length, __n != (b->collation)._M_string_length)) {
    bVar4 = false;
  }
  else if (__n == 0) {
    bVar4 = true;
  }
  else {
    iVar1 = bcmp((a->collation)._M_dataplus._M_p,(b->collation)._M_dataplus._M_p,__n);
    bVar4 = iVar1 == 0;
  }
  return bVar4;
}

Assistant:

bool CollateExpression::Equal(const CollateExpression &a, const CollateExpression &b) {
	if (!a.child->Equals(*b.child)) {
		return false;
	}
	if (a.collation != b.collation) {
		return false;
	}
	return true;
}